

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

void Gia_PolynCorePrintCones(Gia_Man_t *pGia,Vec_Int_t *vLeaves,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint local_2c;
  uint local_28;
  int ConeMax;
  int SuppMax;
  int iObj;
  int i;
  int fVerbose_local;
  Vec_Int_t *vLeaves_local;
  Gia_Man_t *pGia_local;
  
  _i = vLeaves;
  vLeaves_local = (Vec_Int_t *)pGia;
  if (fVerbose == 0) {
    local_28 = 0;
    local_2c = 0;
    iObj = 0;
    for (SuppMax = 0; iVar3 = SuppMax, iVar1 = Vec_IntSize(_i), iVar3 < iVar1; SuppMax = SuppMax + 1
        ) {
      ConeMax = Vec_IntEntry(_i,SuppMax);
      iVar3 = Gia_ManSuppSize((Gia_Man_t *)vLeaves_local,&ConeMax,1);
      local_28 = Abc_MaxInt(local_28,iVar3);
      iVar3 = Gia_ManConeSize((Gia_Man_t *)vLeaves_local,&ConeMax,1);
      local_2c = Abc_MaxInt(local_2c,iVar3);
    }
    uVar2 = Vec_IntSize(_i);
    printf("Remaining cones:  Count = %d.  SuppMax = %d.  ConeMax = %d.\n",(ulong)uVar2,
           (ulong)local_28,(ulong)local_2c);
  }
  else {
    iObj = fVerbose;
    for (SuppMax = 0; iVar3 = SuppMax, iVar1 = Vec_IntSize(_i), iVar3 < iVar1; SuppMax = SuppMax + 1
        ) {
      ConeMax = Vec_IntEntry(_i,SuppMax);
      printf("%4d : ",(ulong)(uint)SuppMax);
      uVar2 = Gia_ManSuppSize((Gia_Man_t *)vLeaves_local,&ConeMax,1);
      printf("Supp = %3d  ",(ulong)uVar2);
      uVar2 = Gia_ManConeSize((Gia_Man_t *)vLeaves_local,&ConeMax,1);
      printf("Cone = %3d  ",(ulong)uVar2);
      printf("\n");
    }
  }
  return;
}

Assistant:

void Gia_PolynCorePrintCones( Gia_Man_t * pGia, Vec_Int_t * vLeaves, int fVerbose )
{
    int i, iObj;
    if ( fVerbose )
    {
        Vec_IntForEachEntry( vLeaves, iObj, i )
        {
            printf( "%4d : ", i );
            printf( "Supp = %3d  ", Gia_ManSuppSize(pGia, &iObj, 1) );
            printf( "Cone = %3d  ", Gia_ManConeSize(pGia, &iObj, 1) );
            printf( "\n" );
        }
    }
    else
    {
        int SuppMax = 0, ConeMax = 0;
        Vec_IntForEachEntry( vLeaves, iObj, i )
        {
            SuppMax = Abc_MaxInt( SuppMax, Gia_ManSuppSize(pGia, &iObj, 1) );
            ConeMax = Abc_MaxInt( ConeMax, Gia_ManConeSize(pGia, &iObj, 1) );
        }
        printf( "Remaining cones:  Count = %d.  SuppMax = %d.  ConeMax = %d.\n", Vec_IntSize(vLeaves), SuppMax, ConeMax );
    }
}